

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmNinjaNormalTargetGenerator::ComputeLinkCmd
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalNinjaGenerator *pcVar3;
  bool bVar4;
  TargetType TVar5;
  cmValue cVar6;
  string *psVar7;
  string_view source;
  string_view str;
  string_view source_00;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string cmakeCommand_1;
  string linkCmdStr;
  string targetOutputReal;
  string linkCmdVar;
  cmAlphaNum local_a0;
  string ruleVar;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  pcVar2 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  TargetLinkLanguage(&cmakeCommand_1,this,config);
  cmGeneratorTarget::GetCreateRuleVariable(&linkCmdVar,pcVar2,&cmakeCommand_1,config);
  std::__cxx11::string::~string((string *)&cmakeCommand_1);
  cVar6 = cmMakefile::GetDefinition(pcVar1,&linkCmdVar);
  if (cVar6.Value == (string *)0x0) {
    std::__cxx11::string::~string((string *)&linkCmdVar);
    TVar5 = cmGeneratorTarget::GetType
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if (TVar5 - SHARED_LIBRARY < 2) {
      return __return_storage_ptr__;
    }
    if (TVar5 == EXECUTABLE) {
      TargetLinkLanguage(&cmakeCommand_1,this,config);
      bVar4 = std::operator==(&cmakeCommand_1,"Swift");
      std::__cxx11::string::~string((string *)&cmakeCommand_1);
      if (!bVar4) {
        return __return_storage_ptr__;
      }
      bVar4 = cmGeneratorTarget::IsExecutableWithExports
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget);
      if (!bVar4) {
        return __return_storage_ptr__;
      }
      pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmakeCommand_1,"CMAKE_EXE_EXPORTS_Swift_FLAG",
                 (allocator<char> *)&local_a0);
      cmMakefile::GetDefExpandList(pcVar1,&cmakeCommand_1,__return_storage_ptr__,false);
      psVar7 = &cmakeCommand_1;
      goto LAB_002b073e;
    }
    if (TVar5 != STATIC_LIBRARY) {
      __assert_fail("false && \"Unexpected target type\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmNinjaNormalTargetGenerator.cxx"
                    ,0x291,
                    "std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd(const std::string &)"
                   );
    }
    pcVar3 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    source_00._M_str = (psVar7->_M_dataplus)._M_p;
    source_00._M_len = psVar7->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&cmakeCommand_1,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_00,SHELL);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                   &cmakeCommand_1," -E rm -f $TARGET_FILE");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&cmakeCommand_1);
    cmakeCommand_1._M_dataplus._M_p = &DAT_00000006;
    cmakeCommand_1._M_string_length = (long)"The CMAKE_" + 4;
    TargetLinkLanguage(&linkCmdStr,this,config);
    local_a0.View_._M_len = linkCmdStr._M_string_length;
    local_a0.View_._M_str = linkCmdStr._M_dataplus._M_p;
    cmStrCat<char[16]>(&linkCmdVar,(cmAlphaNum *)&cmakeCommand_1,&local_a0,
                       (char (*) [16])"_ARCHIVE_CREATE");
    std::__cxx11::string::~string((string *)&linkCmdStr);
    pcVar2 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    TargetLinkLanguage((string *)&local_a0,this,config);
    cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
              (&cmakeCommand_1,pcVar2,&linkCmdVar,(string *)&local_a0,config);
    std::__cxx11::string::operator=((string *)&linkCmdVar,(string *)&cmakeCommand_1);
    std::__cxx11::string::~string((string *)&cmakeCommand_1);
    std::__cxx11::string::~string((string *)&local_a0);
    psVar7 = cmMakefile::GetRequiredDefinition(pcVar1,&linkCmdVar);
    arg_00._M_str = (psVar7->_M_dataplus)._M_p;
    arg_00._M_len = psVar7->_M_string_length;
    cmExpandList(arg_00,__return_storage_ptr__,false);
    std::__cxx11::string::~string((string *)&linkCmdVar);
    cmakeCommand_1._M_dataplus._M_p = &DAT_00000006;
    cmakeCommand_1._M_string_length = (long)"The CMAKE_" + 4;
    TargetLinkLanguage(&linkCmdStr,this,config);
    local_a0.View_._M_len = linkCmdStr._M_string_length;
    local_a0.View_._M_str = linkCmdStr._M_dataplus._M_p;
    cmStrCat<char[16]>(&linkCmdVar,(cmAlphaNum *)&cmakeCommand_1,&local_a0,
                       (char (*) [16])"_ARCHIVE_FINISH");
    std::__cxx11::string::~string((string *)&linkCmdStr);
    pcVar2 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    TargetLinkLanguage((string *)&local_a0,this,config);
    cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
              (&cmakeCommand_1,pcVar2,&linkCmdVar,(string *)&local_a0,config);
    std::__cxx11::string::operator=((string *)&linkCmdVar,(string *)&cmakeCommand_1);
    std::__cxx11::string::~string((string *)&cmakeCommand_1);
    std::__cxx11::string::~string((string *)&local_a0);
    psVar7 = cmMakefile::GetRequiredDefinition(pcVar1,&linkCmdVar);
    arg_01._M_str = (psVar7->_M_dataplus)._M_p;
    arg_01._M_len = psVar7->_M_string_length;
    cmExpandList(arg_01,__return_storage_ptr__,false);
  }
  else {
    std::__cxx11::string::string((string *)&linkCmdStr,(string *)cVar6.Value);
    bVar4 = cmGeneratorTarget::HasImplibGNUtoMS
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget,config);
    if (bVar4) {
      cmakeCommand_1._M_dataplus._M_p = &DAT_00000006;
      cmakeCommand_1._M_string_length = (long)"The CMAKE_" + 4;
      cmGeneratorTarget::GetLinkerLanguage
                (&targetOutputReal,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      local_a0.View_._M_len = targetOutputReal._M_string_length;
      local_a0.View_._M_str = targetOutputReal._M_dataplus._M_p;
      cmStrCat<char[14]>(&ruleVar,(cmAlphaNum *)&cmakeCommand_1,&local_a0,
                         (char (*) [14])"_GNUtoMS_RULE");
      std::__cxx11::string::~string((string *)&targetOutputReal);
      cVar6 = cmMakefile::GetDefinition
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile
                         ,&ruleVar);
      if (cVar6.Value != (string *)0x0) {
        std::__cxx11::string::append((string *)&linkCmdStr);
      }
      std::__cxx11::string::~string((string *)&ruleVar);
    }
    arg._M_str = linkCmdStr._M_dataplus._M_p;
    arg._M_len = linkCmdStr._M_string_length;
    cmExpandList(arg,__return_storage_ptr__,false);
    if ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.UseLWYU == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmakeCommand_1,"CMAKE_LINK_WHAT_YOU_USE_CHECK",
                 (allocator<char> *)&local_a0);
      cVar6 = cmMakefile::GetDefinition(pcVar1,&cmakeCommand_1);
      std::__cxx11::string::~string((string *)&cmakeCommand_1);
      if (cVar6.Value != (string *)0x0) {
        pcVar3 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        source._M_str = (psVar7->_M_dataplus)._M_p;
        source._M_len = psVar7->_M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&targetOutputReal,
                   &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,source,SHELL);
        cmakeCommand_1._M_dataplus._M_p = (pointer)targetOutputReal._M_string_length;
        cmakeCommand_1._M_string_length = (size_type)targetOutputReal._M_dataplus._M_p;
        local_a0.View_._M_len = 0x1c;
        local_a0.View_._M_str = " -E __run_co_compile --lwyu=";
        cmStrCat<>(&ruleVar,(cmAlphaNum *)&cmakeCommand_1,&local_a0);
        std::__cxx11::string::~string((string *)&targetOutputReal);
        str._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
        str._M_len = (cVar6.Value)->_M_string_length;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&cmakeCommand_1,
                   &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->
                    super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,str
                   ,false,false,false,false,false);
        std::__cxx11::string::append((string *)&ruleVar);
        std::__cxx11::string::~string((string *)&cmakeCommand_1);
        cmGeneratorTarget::GetFullPath
                  (&cmakeCommand_1,
                   (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                   GeneratorTarget,config,RuntimeBinaryArtifact,true);
        psVar7 = cmNinjaTargetGenerator::ConvertToNinjaPath
                           (&this->super_cmNinjaTargetGenerator,&cmakeCommand_1);
        std::__cxx11::string::string((string *)&targetOutputReal,(string *)psVar7);
        std::__cxx11::string::~string((string *)&cmakeCommand_1);
        cmakeCommand_1._M_dataplus._M_p = (pointer)0xa;
        cmakeCommand_1._M_string_length = (size_type)anon_var_dwarf_bb0d80;
        local_a0.View_._M_len = targetOutputReal._M_string_length;
        local_a0.View_._M_str = targetOutputReal._M_dataplus._M_p;
        cmStrCat<>(&local_50,(cmAlphaNum *)&cmakeCommand_1,&local_a0);
        std::__cxx11::string::append((string *)&ruleVar);
        std::__cxx11::string::~string((string *)&local_50);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&ruleVar);
        std::__cxx11::string::~string((string *)&targetOutputReal);
        std::__cxx11::string::~string((string *)&ruleVar);
      }
    }
    std::__cxx11::string::~string((string *)&linkCmdStr);
  }
  psVar7 = &linkCmdVar;
LAB_002b073e:
  std::__cxx11::string::~string((string *)psVar7);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd(
  const std::string& config)
{
  std::vector<std::string> linkCmds;
  cmMakefile* mf = this->GetMakefile();
  {
    // If we have a rule variable prefer it. In the case of static libraries
    // this occurs when things like IPO is enabled, and we need to use the
    // CMAKE_<lang>_CREATE_STATIC_LIBRARY_IPO define instead.
    std::string linkCmdVar = this->GetGeneratorTarget()->GetCreateRuleVariable(
      this->TargetLinkLanguage(config), config);
    cmValue linkCmd = mf->GetDefinition(linkCmdVar);
    if (linkCmd) {
      std::string linkCmdStr = *linkCmd;
      if (this->GetGeneratorTarget()->HasImplibGNUtoMS(config)) {
        std::string ruleVar =
          cmStrCat("CMAKE_", this->GeneratorTarget->GetLinkerLanguage(config),
                   "_GNUtoMS_RULE");
        if (cmValue rule = this->Makefile->GetDefinition(ruleVar)) {
          linkCmdStr += *rule;
        }
      }
      cmExpandList(linkCmdStr, linkCmds);
      if (this->UseLWYU) {
        cmValue lwyuCheck = mf->GetDefinition("CMAKE_LINK_WHAT_YOU_USE_CHECK");
        if (lwyuCheck) {
          std::string cmakeCommand = cmStrCat(
            this->GetLocalGenerator()->ConvertToOutputFormat(
              cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL),
            " -E __run_co_compile --lwyu=");
          cmakeCommand +=
            this->GetLocalGenerator()->EscapeForShell(*lwyuCheck);

          std::string targetOutputReal =
            this->ConvertToNinjaPath(this->GetGeneratorTarget()->GetFullPath(
              config, cmStateEnums::RuntimeBinaryArtifact,
              /*realname=*/true));
          cmakeCommand += cmStrCat(" --source=", targetOutputReal);
          linkCmds.push_back(std::move(cmakeCommand));
        }
      }
      return linkCmds;
    }
  }
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      // We have archive link commands set. First, delete the existing archive.
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E rm -f $TARGET_FILE");
      }
      // TODO: Use ARCHIVE_APPEND for archives over a certain size.
      {
        std::string linkCmdVar = cmStrCat(
          "CMAKE_", this->TargetLinkLanguage(config), "_ARCHIVE_CREATE");

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage(config), config);

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        cmExpandList(linkCmd, linkCmds);
      }
      {
        std::string linkCmdVar = cmStrCat(
          "CMAKE_", this->TargetLinkLanguage(config), "_ARCHIVE_FINISH");

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage(config), config);

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        cmExpandList(linkCmd, linkCmds);
      }
#ifdef __APPLE__
      // On macOS ranlib truncates the fractional part of the static archive
      // file modification time.  If the archive and at least one contained
      // object file were created within the same second this will make look
      // the archive older than the object file. On subsequent ninja runs this
      // leads to re-achiving and updating dependent targets.
      // As a work-around we touch the archive after ranlib (see #19222).
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E touch $TARGET_FILE");
      }
#endif
    } break;
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      break;
    case cmStateEnums::EXECUTABLE:
      if (this->TargetLinkLanguage(config) == "Swift") {
        if (this->GeneratorTarget->IsExecutableWithExports()) {
          this->Makefile->GetDefExpandList("CMAKE_EXE_EXPORTS_Swift_FLAG",
                                           linkCmds);
        }
      }
      break;
    default:
      assert(false && "Unexpected target type");
  }
  return linkCmds;
}